

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_string::append
          (xpath_string *this,xpath_string *o,xpath_allocator *alloc)

{
  bool bVar1;
  char *__s;
  size_t __n;
  size_t __n_00;
  char_t *__dest;
  char *pcVar2;
  
  pcVar2 = o->_buffer;
  if (*pcVar2 != '\0') {
    __s = this->_buffer;
    if (((*__s == '\0') && (this->_uses_heap == false)) && (o->_uses_heap == false)) {
      this->_buffer = pcVar2;
    }
    else {
      bVar1 = this->_uses_heap;
      if (bVar1 == true) {
        __n = this->_length_heap;
      }
      else {
        __n = strlen(__s);
      }
      if (o->_uses_heap == true) {
        __n_00 = o->_length_heap;
      }
      else {
        __n_00 = strlen(pcVar2);
      }
      pcVar2 = (char *)0x0;
      if (bVar1 != false) {
        pcVar2 = __s;
      }
      __dest = (char_t *)xpath_allocator::reallocate(alloc,pcVar2,__n + 1,__n + __n_00 + 1);
      if (__dest != (char_t *)0x0) {
        if (this->_uses_heap == false) {
          memcpy(__dest,this->_buffer,__n);
        }
        memcpy(__dest + __n,o->_buffer,__n_00);
        __dest[__n + __n_00] = '\0';
        this->_buffer = __dest;
        this->_uses_heap = true;
        this->_length_heap = __n + __n_00;
      }
    }
  }
  return;
}

Assistant:

void append(const xpath_string& o, xpath_allocator* alloc)
		{
			// skip empty sources
			if (!*o._buffer) return;

			// fast append for constant empty target and constant source
			if (!*_buffer && !_uses_heap && !o._uses_heap)
			{
				_buffer = o._buffer;
			}
			else
			{
				// need to make heap copy
				size_t target_length = length();
				size_t source_length = o.length();
				size_t result_length = target_length + source_length;

				// allocate new buffer
				char_t* result = static_cast<char_t*>(alloc->reallocate(_uses_heap ? const_cast<char_t*>(_buffer) : NULL, (target_length + 1) * sizeof(char_t), (result_length + 1) * sizeof(char_t)));
				if (!result) return;

				// append first string to the new buffer in case there was no reallocation
				if (!_uses_heap) memcpy(result, _buffer, target_length * sizeof(char_t));

				// append second string to the new buffer
				memcpy(result + target_length, o._buffer, source_length * sizeof(char_t));
				result[result_length] = 0;

				// finalize
				_buffer = result;
				_uses_heap = true;
				_length_heap = result_length;
			}
		}